

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O2

queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
* __thiscall
hedg::MarketGenerator::markets_abi_cxx11_
          (queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
           *__return_storage_ptr__,MarketGenerator *this)

{
  value_type *__x;
  
  wait_for_gen(this);
  std::
  queue<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>>
  ::
  queue<std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>,void>
            (__return_storage_ptr__);
  while (__x = (this->markets_).c.
               super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->markets_).c.
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != __x) {
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::push_back(&__return_storage_ptr__->c,__x);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&(this->markets_).c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::queue<std::pair<std::string, Market_Projection> > MarketGenerator::markets() {

	wait_for_gen();
	std::queue<std::pair<std::string, Market_Projection> > temp;
	while (!markets_.empty()) {
		temp.push(markets_.front());
		markets_.pop();
	}
	return temp;
}